

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O2

void __thiscall orphanage_tests::DoS_mapOrphans::test_method(DoS_mapOrphans *this)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  bool bVar10;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> mock_time_in;
  long lVar11;
  uint j;
  uint uVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator pvVar14;
  iterator in_R9;
  CTransactionRef *pCVar15;
  long lVar16;
  ulong uVar17;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar18;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 local_6b0 [32];
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  CTransactionRef txPrev;
  CTransactionRef timeout_tx;
  vector<CTxOut,_std::allocator<CTxOut>_> local_5f8;
  char *local_5d8;
  _Base_ptr local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  _Base_ptr local_5b0;
  CKey key;
  FastRandomContext rng;
  _Rb_tree_node_base local_4d0;
  size_t local_4b0;
  bool local_440;
  _Rb_tree_node_base local_430;
  size_t local_410;
  _Rb_tree_node_base local_400;
  size_t local_3e0;
  pointer puStack_3d8;
  pointer local_3d0;
  pointer puStack_3c8;
  _Rb_tree_node_base local_3b8;
  size_t local_398;
  _Rb_tree_node_base local_388;
  size_t local_368;
  _Rb_tree_node_base local_358;
  size_t local_338;
  pointer pCStack_330;
  pointer local_328;
  pointer pCStack_320;
  pointer local_318;
  pointer pCStack_310;
  pointer local_308;
  uchar auStack_300 [64];
  _Rb_tree_node_base local_2c0;
  size_t local_2a0;
  _Rb_tree_node_base local_290;
  size_t local_270;
  _Rb_tree_node_base local_260;
  size_t local_240;
  _Rb_tree_node_base local_230;
  size_t local_210;
  undefined1 local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  shared_count sStack_1f8;
  pointer local_1f0;
  undefined1 local_1b8 [24];
  size_t expected_num_orphans;
  undefined8 local_198;
  shared_count asStack_190 [2];
  FillableSigningProvider keystore;
  TxOrphanageTest orphanage;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_rng;
  rng.rng.m_aligned.input[1] = 0;
  rng.rng.m_aligned.input[2] = 0;
  rng.rng.m_aligned.input[3] = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  rng.super_RandomMixin<FastRandomContext>._9_7_ = 0;
  rng.rng.m_aligned.input[0] = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = 0x21;
  FastRandomContext::Reseed(this_00,(uint256 *)&rng);
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header.
             _M_header;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  orphanage.super_TxOrphanage.m_next_sweep.__d.__r = (duration)0;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  orphanage.super_TxOrphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.super_TxOrphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.super_TxOrphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.fCompressed = false;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_left;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
  orphanage.m_rng = this_00;
  MakeNewKeyWithFastRandomContext(&key,this_00);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01158ee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5b0 = (_Base_ptr)0xbcb80c;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x78;
  file.m_begin = (iterator)&local_5b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_5c8,msg);
  _cVar18 = 0x4276b6;
  bVar10 = FillableSigningProvider::AddKey(&keystore,&key);
  local_208[0] = bVar10;
  _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  rng.rng.m_aligned.input._8_8_ = &timeout_tx;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_bc2b54;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(anon_var_dwarf_bc2b54 + 0x14);
  rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = 0xf0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = 0x81;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = 0x114;
  rng.rng.m_aligned.input[0] = 0x115c140;
  rng.rng.m_aligned.input[1] = 0;
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5d0 = (_Base_ptr)0xbcb80c;
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&rng,1,0,WARN,_cVar18,(size_t)&local_5d8,
             0x78);
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  mock_time_in = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                           ();
  SetMockTime(mock_time_in.__d.__r);
  for (lVar16 = 0; lVar16 != 0x32; lVar16 = lVar16 + 1) {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&timeout_tx);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&timeout_tx,1);
    *(undefined4 *)
     &((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vout)
      .super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_finish
         = 0;
    RandomMixin<FastRandomContext>::rand256
              ((uint256 *)&rng,&this_00->super_RandomMixin<FastRandomContext>);
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vin).
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT44(rng.rng.m_aligned.input[1],rng.rng.m_aligned.input[0]);
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vout).
    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)rng.rng.m_aligned.input._8_8_;
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vin).
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT62(rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_,
                           CONCAT11(rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_,
                                    (undefined1)rng.super_RandomMixin<FastRandomContext>.bitbuf));
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vin).
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(rng.super_RandomMixin<FastRandomContext>._9_7_,
                           (undefined1)rng.super_RandomMixin<FastRandomContext>.bitbuf_size);
    CScript::operator<<((CScript *)
                        &((timeout_tx.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,OP_1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_5f8,1);
    (local_5f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1000000;
    CKey::GetPubKey((CPubKey *)local_208,&key);
    PKHash::PKHash((PKHash *)local_1b8,(CPubKey *)local_208);
    rng.rng.m_aligned.input[0] = local_1b8._16_4_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = (undefined1)local_1b8._0_8_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = SUB81(local_1b8._0_8_,1);
    rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = SUB86(local_1b8._0_8_,2);
    rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = (undefined1)local_1b8._8_8_;
    rng.super_RandomMixin<FastRandomContext>._9_7_ = SUB87(local_1b8._8_8_,1);
    rng.rng.m_buffer._M_elems[8] = 2;
    GetScriptForDestination((CScript *)&expected_num_orphans,(CTxDestination *)&rng);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_5f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&expected_num_orphans);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&expected_num_orphans);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&rng);
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&rng);
    TxOrphanage::AddTx(&orphanage.super_TxOrphanage,(CTransactionRef *)&rng,lVar16);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &rng.super_RandomMixin<FastRandomContext>.bitbuf_size);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&timeout_tx);
  }
  for (lVar16 = 0; lVar16 != 0x32; lVar16 = lVar16 + 1) {
    TxOrphanageTest::RandomOrphan((TxOrphanageTest *)&txPrev);
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&timeout_tx);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&timeout_tx,1);
    *(undefined4 *)
     &((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vout)
      .super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_finish
         = 0;
    lVar9 = CONCAT44(txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._4_4_,
                     txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._0_4_);
    pCVar3 = *(pointer *)(lVar9 + 0x39);
    pCVar4 = *(pointer *)(lVar9 + 0x41);
    pCVar5 = *(pointer *)(lVar9 + 0x51);
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vin).
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)(lVar9 + 0x49);
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vout).
    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_start =
         pCVar5;
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vin).
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
         pCVar3;
    ((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vin).
    super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish =
         pCVar4;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_5f8,1);
    (local_5f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1000000;
    CKey::GetPubKey((CPubKey *)local_208,&key);
    PKHash::PKHash((PKHash *)local_1b8,(CPubKey *)local_208);
    rng.rng.m_aligned.input[0] = local_1b8._16_4_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = (undefined1)local_1b8._0_8_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = SUB81(local_1b8._0_8_,1);
    rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = SUB86(local_1b8._0_8_,2);
    rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = (undefined1)local_1b8._8_8_;
    rng.super_RandomMixin<FastRandomContext>._9_7_ = SUB87(local_1b8._8_8_,1);
    rng.rng.m_buffer._M_elems[8] = 2;
    GetScriptForDestination((CScript *)&expected_num_orphans,(CTxDestination *)&rng);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_5f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&expected_num_orphans);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&expected_num_orphans);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&rng);
    rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = 0;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = 0;
    local_4d0._M_color = _S_red;
    local_4d0._M_parent = (_Base_ptr)0x0;
    memset(&rng.super_RandomMixin<FastRandomContext>.bitbuf_size,0,0xb8);
    local_4d0._M_left = &local_4d0;
    local_4b0 = 0;
    local_440 = false;
    local_430._M_color = _S_red;
    local_430._M_parent = (_Base_ptr)0x0;
    local_430._M_left = &local_430;
    local_410 = 0;
    local_400._M_color = _S_red;
    local_400._M_parent = (_Base_ptr)0x0;
    local_400._M_left = &local_400;
    local_3b8._M_color = _S_red;
    local_3b8._M_parent = (_Base_ptr)0x0;
    local_3e0 = 0;
    puStack_3d8 = (pointer)0x0;
    local_3d0 = (pointer)0x0;
    puStack_3c8 = (pointer)0x0;
    local_3b8._M_left = &local_3b8;
    local_398 = 0;
    local_388._M_color = _S_red;
    local_388._M_parent = (_Base_ptr)0x0;
    local_388._M_left = &local_388;
    local_368 = 0;
    local_358._M_color = _S_red;
    local_358._M_parent = (_Base_ptr)0x0;
    local_358._M_left = &local_358;
    local_2c0._M_color = _S_red;
    local_2c0._M_parent = (_Base_ptr)0x0;
    local_338 = 0;
    pCStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    pCStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    pCStack_310 = (pointer)0x0;
    local_308 = (pointer)0x0;
    auStack_300[0] = '\0';
    auStack_300[1] = '\0';
    auStack_300[2] = '\0';
    auStack_300[3] = '\0';
    auStack_300[4] = '\0';
    auStack_300[5] = '\0';
    auStack_300[6] = '\0';
    auStack_300[7] = '\0';
    auStack_300[8] = '\0';
    auStack_300[9] = '\0';
    auStack_300[10] = '\0';
    auStack_300[0xb] = '\0';
    auStack_300[0xc] = '\0';
    auStack_300[0xd] = '\0';
    auStack_300[0xe] = '\0';
    auStack_300[0xf] = '\0';
    auStack_300[0x10] = '\0';
    auStack_300[0x11] = '\0';
    auStack_300[0x12] = '\0';
    auStack_300[0x13] = '\0';
    auStack_300[0x14] = '\0';
    auStack_300[0x15] = '\0';
    auStack_300[0x16] = '\0';
    auStack_300[0x17] = '\0';
    auStack_300[0x18] = '\0';
    auStack_300[0x19] = '\0';
    auStack_300[0x1a] = '\0';
    auStack_300[0x1b] = '\0';
    auStack_300[0x1c] = '\0';
    auStack_300[0x1d] = '\0';
    auStack_300[0x1e] = '\0';
    auStack_300[0x1f] = '\0';
    auStack_300[0x20] = '\0';
    auStack_300[0x21] = '\0';
    auStack_300[0x22] = '\0';
    auStack_300[0x23] = '\0';
    auStack_300[0x24] = '\0';
    auStack_300[0x25] = '\0';
    auStack_300[0x26] = '\0';
    auStack_300[0x27] = '\0';
    auStack_300[0x28] = '\0';
    auStack_300[0x29] = '\0';
    auStack_300[0x2a] = '\0';
    auStack_300[0x2b] = '\0';
    auStack_300[0x2c] = '\0';
    auStack_300[0x2d] = '\0';
    auStack_300[0x2e] = '\0';
    auStack_300[0x2f] = '\0';
    auStack_300[0x30] = '\0';
    auStack_300[0x31] = '\0';
    auStack_300[0x32] = '\0';
    auStack_300[0x33] = '\0';
    local_2c0._M_left = &local_2c0;
    local_2a0 = 0;
    local_290._M_color = _S_red;
    local_290._M_parent = (_Base_ptr)0x0;
    local_290._M_left = &local_290;
    local_270 = 0;
    local_260._M_color = _S_red;
    local_260._M_parent = (_Base_ptr)0x0;
    local_260._M_left = &local_260;
    local_240 = 0;
    local_230._M_color = _S_red;
    local_230._M_parent = (_Base_ptr)0x0;
    local_230._M_left = &local_230;
    local_210 = 0;
    local_630 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_628 = "";
    local_640 = &boost::unit_test::basic_cstring<char_const>::null;
    local_638 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x9a;
    file_00.m_begin = (iterator)&local_630;
    msg_00.m_end = pvVar14;
    msg_00.m_begin = pvVar13;
    local_4d0._M_right = local_4d0._M_left;
    local_430._M_right = local_430._M_left;
    local_400._M_right = local_400._M_left;
    local_3b8._M_right = local_3b8._M_left;
    local_388._M_right = local_388._M_left;
    local_358._M_right = local_358._M_left;
    local_2c0._M_right = local_2c0._M_left;
    local_290._M_right = local_290._M_left;
    local_260._M_right = local_260._M_left;
    local_230._M_right = local_230._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_640,
               msg_00);
    _cVar18 = 0x427ca5;
    bVar10 = SignSignature(&keystore.super_SigningProvider,
                           (CTransaction *)
                           CONCAT44(txPrev.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    txPrev.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_),(CMutableTransaction *)&timeout_tx,0,1,
                           (SignatureData *)&rng);
    expected_num_orphans = CONCAT71(expected_num_orphans._1_7_,bVar10);
    local_198 = 0;
    asStack_190[0].pi_ = (sp_counted_base *)0x0;
    local_1b8._0_8_ = "SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty)";
    local_1b8._8_8_ = "";
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)local_1b8;
    local_650 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_648 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_num_orphans,(lazy_ostream *)local_208,1,0,WARN,_cVar18,
               (size_t)&local_650,0x9a);
    boost::detail::shared_count::~shared_count(asStack_190);
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_208);
    TxOrphanage::AddTx(&orphanage.super_TxOrphanage,(CTransactionRef *)local_208,lVar16);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_200);
    SignatureData::~SignatureData((SignatureData *)&rng);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&timeout_tx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  for (lVar16 = 0; lVar16 != 10; lVar16 = lVar16 + 1) {
    TxOrphanageTest::RandomOrphan((TxOrphanageTest *)&txPrev);
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&timeout_tx);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_5f8,1);
    (local_5f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1000000;
    CKey::GetPubKey((CPubKey *)local_208,&key);
    PKHash::PKHash((PKHash *)local_1b8,(CPubKey *)local_208);
    rng.rng.m_aligned.input[0] = local_1b8._16_4_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = (undefined1)local_1b8._0_8_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = SUB81(local_1b8._0_8_,1);
    rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = SUB86(local_1b8._0_8_,2);
    rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = (undefined1)local_1b8._8_8_;
    rng.super_RandomMixin<FastRandomContext>._9_7_ = SUB87(local_1b8._8_8_,1);
    rng.rng.m_buffer._M_elems[8] = 2;
    GetScriptForDestination((CScript *)&expected_num_orphans,(CTxDestination *)&rng);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_5f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&expected_num_orphans);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&expected_num_orphans);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&rng);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&timeout_tx,0xad9);
    lVar9 = CONCAT44(txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._4_4_,
                     txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._0_4_);
    uVar12 = 0;
    while( true ) {
      pvVar13 = (iterator)(ulong)uVar12;
      if ((iterator)
          (((long)timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi -
           (long)timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr) / 0x68) <= pvVar13) break;
      lVar11 = (long)pvVar13 * 0x68;
      *(uint *)((long)&(timeout_tx.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       hash + lVar11 + -0x19) = uVar12;
      uVar6 = *(undefined8 *)(lVar9 + 0x41);
      uVar7 = *(undefined8 *)(lVar9 + 0x49);
      uVar8 = *(undefined8 *)(lVar9 + 0x51);
      puVar1 = (undefined8 *)
               ((long)&(timeout_tx.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       hash + lVar11 + -0x39);
      *puVar1 = *(undefined8 *)(lVar9 + 0x39);
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)
               ((long)&(timeout_tx.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       hash + lVar11 + -0x29);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      uVar12 = uVar12 + 1;
    }
    rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = 0;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = 0;
    local_4d0._M_color = _S_red;
    local_4d0._M_parent = (_Base_ptr)0x0;
    memset(&rng.super_RandomMixin<FastRandomContext>.bitbuf_size,0,0xb8);
    local_4d0._M_left = &local_4d0;
    local_4b0 = 0;
    local_440 = false;
    local_430._M_color = _S_red;
    local_430._M_parent = (_Base_ptr)0x0;
    local_430._M_left = &local_430;
    local_410 = 0;
    local_400._M_color = _S_red;
    local_400._M_parent = (_Base_ptr)0x0;
    local_400._M_left = &local_400;
    local_3b8._M_color = _S_red;
    local_3b8._M_parent = (_Base_ptr)0x0;
    local_3e0 = 0;
    puStack_3d8 = (pointer)0x0;
    local_3d0 = (pointer)0x0;
    puStack_3c8 = (pointer)0x0;
    local_3b8._M_left = &local_3b8;
    local_398 = 0;
    local_388._M_color = _S_red;
    local_388._M_parent = (_Base_ptr)0x0;
    local_388._M_left = &local_388;
    local_368 = 0;
    local_358._M_color = _S_red;
    local_358._M_parent = (_Base_ptr)0x0;
    local_358._M_left = &local_358;
    local_2c0._M_color = _S_red;
    local_2c0._M_parent = (_Base_ptr)0x0;
    local_338 = 0;
    pCStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    pCStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    pCStack_310 = (pointer)0x0;
    local_308 = (pointer)0x0;
    auStack_300[0] = '\0';
    auStack_300[1] = '\0';
    auStack_300[2] = '\0';
    auStack_300[3] = '\0';
    auStack_300[4] = '\0';
    auStack_300[5] = '\0';
    auStack_300[6] = '\0';
    auStack_300[7] = '\0';
    auStack_300[8] = '\0';
    auStack_300[9] = '\0';
    auStack_300[10] = '\0';
    auStack_300[0xb] = '\0';
    auStack_300[0xc] = '\0';
    auStack_300[0xd] = '\0';
    auStack_300[0xe] = '\0';
    auStack_300[0xf] = '\0';
    auStack_300[0x10] = '\0';
    auStack_300[0x11] = '\0';
    auStack_300[0x12] = '\0';
    auStack_300[0x13] = '\0';
    auStack_300[0x14] = '\0';
    auStack_300[0x15] = '\0';
    auStack_300[0x16] = '\0';
    auStack_300[0x17] = '\0';
    auStack_300[0x18] = '\0';
    auStack_300[0x19] = '\0';
    auStack_300[0x1a] = '\0';
    auStack_300[0x1b] = '\0';
    auStack_300[0x1c] = '\0';
    auStack_300[0x1d] = '\0';
    auStack_300[0x1e] = '\0';
    auStack_300[0x1f] = '\0';
    auStack_300[0x20] = '\0';
    auStack_300[0x21] = '\0';
    auStack_300[0x22] = '\0';
    auStack_300[0x23] = '\0';
    auStack_300[0x24] = '\0';
    auStack_300[0x25] = '\0';
    auStack_300[0x26] = '\0';
    auStack_300[0x27] = '\0';
    auStack_300[0x28] = '\0';
    auStack_300[0x29] = '\0';
    auStack_300[0x2a] = '\0';
    auStack_300[0x2b] = '\0';
    auStack_300[0x2c] = '\0';
    auStack_300[0x2d] = '\0';
    auStack_300[0x2e] = '\0';
    auStack_300[0x2f] = '\0';
    auStack_300[0x30] = '\0';
    auStack_300[0x31] = '\0';
    auStack_300[0x32] = '\0';
    auStack_300[0x33] = '\0';
    local_2c0._M_left = &local_2c0;
    local_2a0 = 0;
    local_290._M_color = _S_red;
    local_290._M_parent = (_Base_ptr)0x0;
    local_290._M_left = &local_290;
    local_270 = 0;
    local_260._M_color = _S_red;
    local_260._M_parent = (_Base_ptr)0x0;
    local_260._M_left = &local_260;
    local_240 = 0;
    local_230._M_color = _S_red;
    local_230._M_parent = (_Base_ptr)0x0;
    local_230._M_left = &local_230;
    local_210 = 0;
    local_660 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_658 = "";
    local_670 = &boost::unit_test::basic_cstring<char_const>::null;
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xaf;
    file_01.m_begin = (iterator)&local_660;
    msg_01.m_end = pvVar14;
    msg_01.m_begin = pvVar13;
    local_4d0._M_right = local_4d0._M_left;
    local_430._M_right = local_430._M_left;
    local_400._M_right = local_400._M_left;
    local_3b8._M_right = local_3b8._M_left;
    local_388._M_right = local_388._M_left;
    local_358._M_right = local_358._M_left;
    local_2c0._M_right = local_2c0._M_left;
    local_290._M_right = local_290._M_left;
    local_260._M_right = local_260._M_left;
    local_230._M_right = local_230._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_670,
               msg_01);
    uVar17 = 1;
    _cVar18 = 0x4281cd;
    bVar10 = SignSignature(&keystore.super_SigningProvider,
                           (CTransaction *)
                           CONCAT44(txPrev.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    txPrev.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_),(CMutableTransaction *)&timeout_tx,0,1,
                           (SignatureData *)&rng);
    expected_num_orphans = CONCAT71(expected_num_orphans._1_7_,bVar10);
    local_198 = 0;
    asStack_190[0].pi_ = (sp_counted_base *)0x0;
    local_1b8._0_8_ = "SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty)";
    local_1b8._8_8_ = "";
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)local_1b8;
    local_680 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_678 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_num_orphans,(lazy_ostream *)local_208,1,0,WARN,_cVar18,
               (size_t)&local_680,0xaf);
    boost::detail::shared_count::~shared_count(asStack_190);
    while( true ) {
      if ((ulong)(((long)timeout_tx.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi -
                  (long)timeout_tx.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr) /
                 0x68) <= uVar17) break;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)&(timeout_tx.
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->hash + uVar17 * 0x68 + -0x11),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 &((timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      uVar17 = (ulong)((int)uVar17 + 1);
    }
    local_690 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_688 = "";
    local_6b0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b0._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xb5;
    file_02.m_begin = (iterator)&local_690;
    msg_02.m_end = pvVar14;
    msg_02.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
               (size_t)(local_6b0 + 0x10),msg_02);
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_1b8);
    _cVar18 = 0x428349;
    bVar10 = TxOrphanage::AddTx(&orphanage.super_TxOrphanage,(CTransactionRef *)local_1b8,lVar16);
    expected_num_orphans = CONCAT71(expected_num_orphans._1_7_,!bVar10);
    local_198 = 0;
    asStack_190[0].pi_ = (sp_counted_base *)0x0;
    local_6b0._0_8_ = "!orphanage.AddTx(MakeTransactionRef(tx), i)";
    local_6b0._8_8_ = "";
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)local_6b0;
    local_6c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_6b8 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_num_orphans,(lazy_ostream *)local_208,1,0,WARN,_cVar18,
               (size_t)&local_6c0,0xb5);
    boost::detail::shared_count::~shared_count(asStack_190);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
    SignatureData::~SignatureData((SignatureData *)&rng);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&timeout_tx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  expected_num_orphans =
       orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
  TxOrphanage::EraseForPeer(&orphanage.super_TxOrphanage,-1);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xbc;
  file_03.m_begin = (iterator)&local_6d0;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6e0,
             msg_03);
  rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = 0xb0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = 0x80;
  rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = 0x114;
  rng.rng.m_aligned.input[0] = 0x115c140;
  rng.rng.m_aligned.input[1] = 0;
  rng.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6e8 = "";
  pvVar13 = local_208;
  local_208 = (undefined1  [8])
              orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&rng,&local_6f0,0xbc,1,2,pvVar13,"orphanage.CountOrphans()",&expected_num_orphans,
             "expected_num_orphans");
  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
    TxOrphanage::EraseForPeer(&orphanage.super_TxOrphanage,lVar16);
    expected_num_orphans = expected_num_orphans - 2;
    local_700 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_6f8 = "";
    local_710 = &boost::unit_test::basic_cstring<char_const>::null;
    local_708 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar18 = 0x4285ae;
    file_04.m_end = (iterator)0xc4;
    file_04.m_begin = (iterator)&local_700;
    msg_04.m_end = pvVar13;
    msg_04.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_710,
               msg_04);
    local_208[0] = orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count == expected_num_orphans;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_bc2c09;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbcb8e2;
    rng.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._0_1_ = 0xf0;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._1_1_ = 0x81;
    rng.super_RandomMixin<FastRandomContext>.bitbuf._2_6_ = 0x114;
    rng.rng.m_aligned.input[0] = 0x115c140;
    rng.rng.m_aligned.input[1] = 0;
    local_720 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_718 = "";
    pvVar14 = &DAT_00000001;
    pvVar13 = (iterator)0x0;
    rng.rng.m_aligned.input._8_8_ = (CMutableTransaction *)&timeout_tx;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_208,(lazy_ostream *)&rng,1,0,WARN,_cVar18,
               (size_t)&local_720,0xc4);
    boost::detail::shared_count::~shared_count(&sStack_1f8);
  }
  FastRandomContext::FastRandomContext(&rng,true);
  TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,(uint)expected_num_orphans,&rng);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xca;
  file_05.m_begin = (iterator)&local_730;
  msg_05.m_end = pvVar13;
  msg_05.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_740,
             msg_05);
  _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (pointer)0xc7f1cc;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_748 = "";
  pCVar15 = &timeout_tx;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_208,&local_750,0xca,1,2,pCVar15,"orphanage.CountOrphans()",&expected_num_orphans,
             "expected_num_orphans");
  expected_num_orphans = expected_num_orphans - 1;
  TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,(uint)expected_num_orphans,&rng);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xcd;
  file_06.m_begin = (iterator)&local_760;
  msg_06.m_end = (iterator)pCVar15;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_770,
             msg_06);
  _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (pointer)0xc7f1cc;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_778 = "";
  pCVar15 = &timeout_tx;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_208,&local_780,0xcd,1,2,pCVar15,"orphanage.CountOrphans()",&expected_num_orphans,
             "expected_num_orphans");
  if (0x28 < expected_num_orphans) {
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,0x28,&rng);
    local_790 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_788 = "";
    local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_798 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0xd0;
    file_07.m_begin = (iterator)&local_790;
    msg_07.m_end = (iterator)pCVar15;
    msg_07.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_7a0,
               msg_07);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_7b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_7a8 = "";
    pCVar15 = &timeout_tx;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1b8[0] = '(';
    local_1b8[1] = '\0';
    local_1b8[2] = '\0';
    local_1b8[3] = '\0';
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_7b0,0xd0,1,2,pCVar15,"orphanage.CountOrphans()",local_1b8,"40");
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,10,&rng);
    local_7c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_7b8 = "";
    local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0xd2;
    file_08.m_begin = (iterator)&local_7c0;
    msg_08.m_end = (iterator)pCVar15;
    msg_08.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_7d0,
               msg_08);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_7e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_7d8 = "";
    pCVar15 = &timeout_tx;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1b8[0] = '\n';
    local_1b8[1] = '\0';
    local_1b8[2] = '\0';
    local_1b8[3] = '\0';
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_7e0,0xd2,1,2,pCVar15,"orphanage.CountOrphans()",local_1b8,"10");
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,0,&rng);
    local_7f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_7e8 = "";
    local_800 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0xd4;
    file_09.m_begin = (iterator)&local_7f0;
    msg_09.m_end = (iterator)pCVar15;
    msg_09.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_800,
               msg_09);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_810 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_808 = "";
    pCVar15 = &timeout_tx;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1b8._0_8_ = (ulong)(uint)local_1b8._4_4_ << 0x20;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_810,0xd4,1,2,pCVar15,"orphanage.CountOrphans()",local_1b8,"0");
    local_208 = (undefined1  [8])0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    MakeTransactionSpending
              ((orphanage_tests *)&timeout_tx,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_208,&rng);
    std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
              ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)local_208);
    TxOrphanage::AddTx(&orphanage.super_TxOrphanage,&timeout_tx,0);
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,1,&rng);
    local_820 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_818 = "";
    local_830 = &boost::unit_test::basic_cstring<char_const>::null;
    local_828 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0xda;
    file_10.m_begin = (iterator)&local_820;
    msg_10.m_end = (iterator)pCVar15;
    msg_10.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_830,
               msg_10);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_840 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_838 = "";
    pvVar13 = local_1b8;
    local_1b8._0_8_ =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
    pvVar14 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_840,0xda,1,2,pvVar13,"orphanage.CountOrphans()",&txPrev,"1");
    SetMockTime((seconds)((long)mock_time_in.__d.__r + 0x4af));
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,1,&rng);
    local_850 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_848 = "";
    local_860 = &boost::unit_test::basic_cstring<char_const>::null;
    local_858 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0xdf;
    file_11.m_begin = (iterator)&local_850;
    msg_11.m_end = pvVar13;
    msg_11.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_860,
               msg_11);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_870 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_868 = "";
    pvVar13 = local_1b8;
    local_1b8._0_8_ =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
    pvVar14 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_870,0xdf,1,2,pvVar13,"orphanage.CountOrphans()",&txPrev,"1");
    SetMockTime((seconds)((long)mock_time_in.__d.__r + 0x4b0));
    local_880 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_878 = "";
    local_890 = &boost::unit_test::basic_cstring<char_const>::null;
    local_888 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0xe3;
    file_12.m_begin = (iterator)&local_880;
    msg_12.m_end = pvVar13;
    msg_12.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_890,
               msg_12);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_8a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_898 = "";
    pvVar13 = local_1b8;
    local_1b8._0_8_ =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
    pvVar14 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_8a0,0xe3,1,2,pvVar13,"orphanage.CountOrphans()",&txPrev,"1");
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,1,&rng);
    local_8b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_8a8 = "";
    local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0xe5;
    file_13.m_begin = (iterator)&local_8b0;
    msg_13.m_end = pvVar13;
    msg_13.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_8c0,
               msg_13);
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (pointer)0xc7f1cc;
    local_8d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_8c8 = "";
    local_1b8._0_8_ =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_208,&local_8d0,0xe5,1,2,local_1b8,"orphanage.CountOrphans()",&txPrev,"0");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ChaCha20::~ChaCha20(&rng.rng);
    FillableSigningProvider::~FillableSigningProvider(&keystore);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
    TxOrphanage::~TxOrphanage(&orphanage.super_TxOrphanage);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("expected_num_orphans > 40",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
                ,0xce,"void orphanage_tests::DoS_mapOrphans::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(DoS_mapOrphans)
{
    // This test had non-deterministic coverage due to
    // randomly selected seeds.
    // This seed is chosen so that all branches of the function
    // ecdsa_signature_parse_der_lax are executed during this test.
    // Specifically branches that run only when an ECDSA
    // signature's R and S values have leading zeros.
    m_rng.Reseed(uint256{33});

    TxOrphanageTest orphanage{m_rng};
    CKey key;
    MakeNewKeyWithFastRandomContext(key, m_rng);
    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKey(key));

    // Freeze time for length of test
    auto now{GetTime<std::chrono::seconds>()};
    SetMockTime(now);

    // 50 orphan transactions:
    for (int i = 0; i < 50; i++)
    {
        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vin[0].prevout.n = 0;
        tx.vin[0].prevout.hash = Txid::FromUint256(m_rng.rand256());
        tx.vin[0].scriptSig << OP_1;
        tx.vout.resize(1);
        tx.vout[0].nValue = 1*CENT;
        tx.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));

        orphanage.AddTx(MakeTransactionRef(tx), i);
    }

    // ... and 50 that depend on other orphans:
    for (int i = 0; i < 50; i++)
    {
        CTransactionRef txPrev = orphanage.RandomOrphan();

        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vin[0].prevout.n = 0;
        tx.vin[0].prevout.hash = txPrev->GetHash();
        tx.vout.resize(1);
        tx.vout[0].nValue = 1*CENT;
        tx.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
        SignatureData empty;
        BOOST_CHECK(SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty));

        orphanage.AddTx(MakeTransactionRef(tx), i);
    }

    // This really-big orphan should be ignored:
    for (int i = 0; i < 10; i++)
    {
        CTransactionRef txPrev = orphanage.RandomOrphan();

        CMutableTransaction tx;
        tx.vout.resize(1);
        tx.vout[0].nValue = 1*CENT;
        tx.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
        tx.vin.resize(2777);
        for (unsigned int j = 0; j < tx.vin.size(); j++)
        {
            tx.vin[j].prevout.n = j;
            tx.vin[j].prevout.hash = txPrev->GetHash();
        }
        SignatureData empty;
        BOOST_CHECK(SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty));
        // Reuse same signature for other inputs
        // (they don't have to be valid for this test)
        for (unsigned int j = 1; j < tx.vin.size(); j++)
            tx.vin[j].scriptSig = tx.vin[0].scriptSig;

        BOOST_CHECK(!orphanage.AddTx(MakeTransactionRef(tx), i));
    }

    size_t expected_num_orphans = orphanage.CountOrphans();

    // Non-existent peer; nothing should be deleted
    orphanage.EraseForPeer(/*peer=*/-1);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), expected_num_orphans);

    // Each of first three peers stored
    // two transactions each.
    for (NodeId i = 0; i < 3; i++)
    {
        orphanage.EraseForPeer(i);
        expected_num_orphans -= 2;
        BOOST_CHECK(orphanage.CountOrphans() == expected_num_orphans);
    }

    // Test LimitOrphanTxSize() function, nothing should timeout:
    FastRandomContext rng{/*fDeterministic=*/true};
    orphanage.LimitOrphans(/*max_orphans=*/expected_num_orphans, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), expected_num_orphans);
    expected_num_orphans -= 1;
    orphanage.LimitOrphans(/*max_orphans=*/expected_num_orphans, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), expected_num_orphans);
    assert(expected_num_orphans > 40);
    orphanage.LimitOrphans(40, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 40);
    orphanage.LimitOrphans(10, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 10);
    orphanage.LimitOrphans(0, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 0);

    // Add one more orphan, check timeout logic
    auto timeout_tx = MakeTransactionSpending(/*outpoints=*/{}, rng);
    orphanage.AddTx(timeout_tx, 0);
    orphanage.LimitOrphans(1, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 1);

    // One second shy of expiration
    SetMockTime(now + ORPHAN_TX_EXPIRE_TIME - 1s);
    orphanage.LimitOrphans(1, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 1);

    // Jump one more second, orphan should be timed out on limiting
    SetMockTime(now + ORPHAN_TX_EXPIRE_TIME);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 1);
    orphanage.LimitOrphans(1, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 0);
}